

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void * __thiscall
mpt::content<mpt::message_store::entry>::insert(content<mpt::message_store::entry> *this,long pos)

{
  void *pvVar1;
  
  if ((pos < 0) && (pos = pos + ((this->super_buffer)._used >> 3), pos < 0)) {
    return (void *)0x0;
  }
  pvVar1 = buffer::insert(&this->super_buffer,pos << 3,8);
  return pvVar1;
}

Assistant:

void *insert(long pos)
	{
		if (pos < 0) {
			pos += _used / sizeof(T);
			if (pos < 0) {
				return 0;
			}
		}
		/* inserted data is NOT initialized */
		return buffer::insert(pos * sizeof(T), sizeof(T));
	}